

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_image * nk_image_handle(nk_handle handle)

{
  nk_handle *in_RDI;
  
  *in_RDI = handle;
  in_RDI[1].ptr = (void *)0x0;
  in_RDI[2].ptr = (void *)0x0;
  in_RDI[2].id = 0;
  return (nk_image *)in_RDI;
}

Assistant:

NK_API struct nk_image
nk_image_handle(nk_handle handle)
{
struct nk_image s;
nk_zero(&s, sizeof(s));
s.handle = handle;
s.w = 0; s.h = 0;
s.region[0] = 0;
s.region[1] = 0;
s.region[2] = 0;
s.region[3] = 0;
return s;
}